

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.cpp
# Opt level: O0

string * __thiscall
StringTools::generateRandomString_abi_cxx11_
          (string *__return_storage_ptr__,StringTools *this,size_t length)

{
  int iVar1;
  char *pcVar2;
  StringTools *local_38;
  size_t i;
  allocator local_19;
  StringTools *local_18;
  size_t length_local;
  string *result;
  
  local_18 = this;
  length_local = (size_t)__return_storage_ptr__;
  if ((generateRandomString[abi:cxx11](unsigned_long)::chars_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&generateRandomString[abi:cxx11](unsigned_long)::chars_abi_cxx11_)
     , iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&generateRandomString[abi:cxx11](unsigned_long)::chars_abi_cxx11_,
               "qwertyuiopasdfghjklzxcvbnmQWERTYUIOPASDFGHJKLZXCVBNM1234567890-=[]\\;\',./!@#$%^&*()_+{}|:\"<>?`~"
               ,&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
    __cxa_atexit(std::__cxx11::string::~string,
                 &generateRandomString[abi:cxx11](unsigned_long)::chars_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&generateRandomString[abi:cxx11](unsigned_long)::chars_abi_cxx11_);
  }
  if ((generateRandomString[abi:cxx11](unsigned_long)::charsLen == '\0') &&
     (iVar1 = __cxa_guard_acquire(&generateRandomString[abi:cxx11](unsigned_long)::charsLen),
     iVar1 != 0)) {
    generateRandomString::charsLen = std::__cxx11::string::length();
    __cxa_guard_release(&generateRandomString[abi:cxx11](unsigned_long)::charsLen);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_38 = (StringTools *)0x0; local_38 < local_18; local_38 = local_38 + 1) {
    rand();
    pcVar2 = (char *)std::__cxx11::string::operator[](0x521908);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string generateRandomString(size_t length) {
    static const string chars("qwertyuiopasdfghjklzxcvbnmQWERTYUIOPASDFGHJKLZXCVBNM1234567890-=[]\\;',./!@#$%^&*()_+{}|:\"<>?`~");
    static const size_t charsLen = chars.length();
    string result;
    for (size_t i = 0; i < length; ++i) {
        result += chars[rand() % charsLen];
    }
    return result;
}